

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# quicly.c
# Opt level: O0

int on_ack_handshake_done
              (quicly_sentmap_t *map,quicly_sent_packet_t *packet,int acked,quicly_sent_t *sent)

{
  quicly_conn_t *conn;
  quicly_sent_t *sent_local;
  int acked_local;
  quicly_sent_packet_t *packet_local;
  quicly_sentmap_t *map_local;
  
  if (acked == 0) {
    *(byte *)((long)&map[9]._pending_packet + 4) =
         *(byte *)((long)&map[9]._pending_packet + 4) | 0x40;
  }
  else {
    *(byte *)((long)&map[9]._pending_packet + 4) =
         *(byte *)((long)&map[9]._pending_packet + 4) & 0xbf;
  }
  return 0;
}

Assistant:

static int on_ack_handshake_done(quicly_sentmap_t *map, const quicly_sent_packet_t *packet, int acked, quicly_sent_t *sent)
{
    quicly_conn_t *conn = (quicly_conn_t *)((char *)map - offsetof(quicly_conn_t, egress.loss.sentmap));

    /* When lost, reschedule for transmission. When acked, suppress retransmission if scheduled. */
    if (acked) {
        conn->egress.pending_flows &= ~QUICLY_PENDING_FLOW_HANDSHAKE_DONE_BIT;
    } else {
        conn->egress.pending_flows |= QUICLY_PENDING_FLOW_HANDSHAKE_DONE_BIT;
    }
    return 0;
}